

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool build_pit(chunk_conflict *c,loc centre,wchar_t rating)

{
  wchar_t wVar1;
  undefined8 uVar2;
  monster_group_info group_info;
  monster_group_info group_info_00;
  monster_group_info group_info_01;
  monster_group_info group_info_02;
  monster_group_info group_info_03;
  monster_group_info group_info_04;
  monster_group_info group_info_05;
  monster_group_info group_info_06;
  monster_group_info group_info_07;
  monster_group_info group_info_08;
  monster_group_info group_info_09;
  monster_group_info group_info_10;
  monster_group_info group_info_11;
  monster_group_info group_info_12;
  monster_group_info group_info_13;
  monster_group_info group_info_14;
  monster_group_info group_info_15;
  monster_group_info group_info_16;
  monster_group_info group_info_17;
  monster_group_info group_info_18;
  monster_group_info group_info_19;
  monster_group_info group_info_20;
  monster_group_info group_info_21;
  bool bVar3;
  _Bool _Var4;
  wchar_t wVar5;
  wchar_t y2_00;
  wchar_t x1_00;
  wchar_t x2_00;
  int iVar6;
  uint32_t uVar7;
  monster_race *pmVar8;
  loc_conflict lVar9;
  loc grid;
  monster_race *tmp;
  wchar_t p2;
  wchar_t p1;
  wchar_t i2;
  wchar_t i1;
  monster_group_info info;
  wchar_t group_index;
  wchar_t width;
  wchar_t height;
  wchar_t alloc_obj;
  wchar_t light;
  _Bool empty;
  wchar_t x2;
  wchar_t y2;
  wchar_t x1;
  wchar_t y1;
  wchar_t x;
  wchar_t y;
  wchar_t j;
  wchar_t i;
  monster_race *what [16];
  wchar_t rating_local;
  chunk_conflict *c_local;
  wchar_t wStack_10;
  loc centre_local;
  
  bVar3 = false;
  info.player_race._4_4_ = 0xf;
  info.player_race._0_4_ = 0;
  what[0xf]._4_4_ = rating;
  unique0x10000fca = (loc_conflict)centre;
  memset(&i2,0,0x10);
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,L'\v',info.player_race._4_4_ + L'\x02');
  if (((wStack_10 < c->height) && (c_local._4_4_ < c->width)) ||
     (_Var4 = find_space((loc *)((long)&c_local + 4),L'\v',info.player_race._4_4_ + L'\x02'), _Var4)
     ) {
    wVar1 = wStack_10;
    wVar5 = wStack_10 + L'\xfffffffc';
    y2_00 = wStack_10 + L'\x04';
    x1_00 = c_local._4_4_ - info.player_race._4_4_ / 2;
    x2_00 = c_local._4_4_ + info.player_race._4_4_ / 2;
    generate_room(c,wStack_10 + L'\xfffffffb',x1_00 + L'\xffffffff',wStack_10 + L'\x05',
                  x2_00 + L'\x01',L'\0');
    draw_rectangle(c,wVar1 + L'\xfffffffb',x1_00 + L'\xffffffff',wVar1 + L'\x05',x2_00 + L'\x01',
                   FEAT_GRANITE,L'\f',false);
    fill_rectangle(c,wVar5,x1_00,y2_00,x2_00,FEAT_FLOOR,L'\0');
    draw_rectangle(c,wVar1 + L'\xfffffffd',x1_00 + L'\x01',wVar1 + L'\x03',x2_00 + L'\xffffffff',
                   FEAT_GRANITE,L'\v',false);
    generate_hole(c,wVar1 + L'\xfffffffd',x1_00 + L'\x01',wVar1 + L'\x03',x2_00 + L'\xffffffff',
                  FEAT_CLOSED);
    set_pit_type(c->depth,L'\x01');
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,dun->pit_type->name);
    wVar1 = dun->pit_type->obj_rarity;
    get_mon_num_prep(mon_pit_hook);
    for (y = L'\0'; y < L'\x10'; y = y + L'\x01') {
      pmVar8 = get_mon_num(c->depth + L'\n',c->depth);
      *(monster_race **)(&j + (long)y * 2) = pmVar8;
      if (*(long *)(&j + (long)y * 2) == 0) {
        bVar3 = true;
      }
    }
    get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
    if (bVar3) {
      centre_local.x._3_1_ = false;
    }
    else {
      if (((player->opts).opt[0x18] & 1U) != 0) {
        msg("Monster pit (%s)",dun->pit_type->name);
      }
      for (y = L'\0'; y < L'\x0f'; y = y + L'\x01') {
        for (x = L'\0'; x < L'\x0f'; x = x + L'\x01') {
          iVar6 = x + L'\x01';
          if (*(int *)(*(long *)(&j + (long)iVar6 * 2) + 0x80) <
              *(int *)(*(long *)(&j + (long)x * 2) + 0x80)) {
            uVar2 = *(undefined8 *)(&j + (long)x * 2);
            *(undefined8 *)(&j + (long)x * 2) = *(undefined8 *)(&j + (long)iVar6 * 2);
            *(undefined8 *)(&j + (long)iVar6 * 2) = uVar2;
          }
        }
      }
      for (y = L'\0'; y < L'\b'; y = y + L'\x01') {
        *(undefined8 *)(&j + (long)y * 2) = *(undefined8 *)(&j + (long)(y << 1) * 2);
      }
      add_to_monster_rating((chunk *)c,dun->pit_type->ave / 0x14 + 3);
      i2 = monster_group_index_new((chunk *)c);
      i1 = L'\0';
      group_info.role = MON_GROUP_LEADER;
      group_info.index = i2;
      group_info.player_race._0_4_ = info.index;
      group_info.player_race._4_4_ = info.role;
      info.player_race._0_4_ = i2;
      place_new_monster((chunk *)c,stack0xffffffffffffffec,what[6],false,false,group_info,'\f');
      i1 = L'\x01';
      for (x1 = c_local._4_4_ + L'\xfffffffd'; x1 <= c_local._4_4_ + L'\x03'; x1 = x1 + L'\x01') {
        lVar9 = (loc_conflict)loc(x1,wStack_10 + L'\xfffffffe');
        group_info_00.role = i1;
        group_info_00.index = i2;
        group_info_00.player_race._0_4_ = info.index;
        group_info_00.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,_j,false,false,group_info_00,'\f');
        lVar9 = (loc_conflict)loc(x1,wStack_10 + L'\x02');
        group_info_01.role = i1;
        group_info_01.index = i2;
        group_info_01.player_race._0_4_ = info.index;
        group_info_01.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,_j,false,false,group_info_01,'\f');
      }
      for (x1 = c_local._4_4_ + L'\xfffffffb'; x1 <= c_local._4_4_ + L'\xfffffffc';
          x1 = x1 + L'\x01') {
        lVar9 = (loc_conflict)loc(x1,wStack_10 + L'\xfffffffe');
        group_info_02.role = i1;
        group_info_02.index = i2;
        group_info_02.player_race._0_4_ = info.index;
        group_info_02.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,what[0],false,false,group_info_02,'\f');
        lVar9 = (loc_conflict)loc(x1,wStack_10 + L'\x02');
        group_info_03.role = i1;
        group_info_03.index = i2;
        group_info_03.player_race._0_4_ = info.index;
        group_info_03.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,what[0],false,false,group_info_03,'\f');
      }
      x1 = c_local._4_4_ + L'\x04';
      while( true ) {
        if (c_local._4_4_ + L'\x05' < x1) break;
        lVar9 = (loc_conflict)loc(x1,wStack_10 + L'\xfffffffe');
        group_info_04.role = i1;
        group_info_04.index = i2;
        group_info_04.player_race._0_4_ = info.index;
        group_info_04.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,what[0],false,false,group_info_04,'\f');
        lVar9 = (loc_conflict)loc(x1,wStack_10 + L'\x02');
        group_info_05.role = i1;
        group_info_05.index = i2;
        group_info_05.player_race._0_4_ = info.index;
        group_info_05.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,what[0],false,false,group_info_05,'\f');
        x1 = x1 + L'\x01';
      }
      y1 = wStack_10 + L'\xffffffff';
      while( true ) {
        if (wStack_10 + L'\x01' < y1) break;
        lVar9 = (loc_conflict)loc(c_local._4_4_ + L'\xfffffffb',y1);
        group_info_06.role = i1;
        group_info_06.index = i2;
        group_info_06.player_race._0_4_ = info.index;
        group_info_06.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,_j,false,false,group_info_06,'\f');
        lVar9 = (loc_conflict)loc(c_local._4_4_ + L'\x05',y1);
        group_info_07.role = i1;
        group_info_07.index = i2;
        group_info_07.player_race._0_4_ = info.index;
        group_info_07.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,_j,false,false,group_info_07,'\f');
        lVar9 = (loc_conflict)loc(c_local._4_4_ + L'\xfffffffc',y1);
        group_info_08.role = i1;
        group_info_08.index = i2;
        group_info_08.player_race._0_4_ = info.index;
        group_info_08.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,what[0],false,false,group_info_08,'\f');
        lVar9 = (loc_conflict)loc(c_local._4_4_ + L'\x04',y1);
        group_info_09.role = i1;
        group_info_09.index = i2;
        group_info_09.player_race._0_4_ = info.index;
        group_info_09.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,what[0],false,false,group_info_09,'\f');
        lVar9 = (loc_conflict)loc(c_local._4_4_ + L'\xfffffffd',y1);
        group_info_10.role = i1;
        group_info_10.index = i2;
        group_info_10.player_race._0_4_ = info.index;
        group_info_10.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,what[1],false,false,group_info_10,'\f');
        lVar9 = (loc_conflict)loc(c_local._4_4_ + L'\x03',y1);
        group_info_11.role = i1;
        group_info_11.index = i2;
        group_info_11.player_race._0_4_ = info.index;
        group_info_11.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,what[1],false,false,group_info_11,'\f');
        lVar9 = (loc_conflict)loc(c_local._4_4_ + L'\xfffffffe',y1);
        group_info_12.role = i1;
        group_info_12.index = i2;
        group_info_12.player_race._0_4_ = info.index;
        group_info_12.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,what[2],false,false,group_info_12,'\f');
        lVar9 = (loc_conflict)loc(c_local._4_4_ + L'\x02',y1);
        group_info_13.role = i1;
        group_info_13.index = i2;
        group_info_13.player_race._0_4_ = info.index;
        group_info_13.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,what[2],false,false,group_info_13,'\f');
        y1 = y1 + L'\x01';
      }
      lVar9 = (loc_conflict)loc(c_local._4_4_ + L'\xffffffff',wStack_10 + L'\xffffffff');
      group_info_14.role = i1;
      group_info_14.index = i2;
      group_info_14.player_race._0_4_ = info.index;
      group_info_14.player_race._4_4_ = info.role;
      place_new_monster((chunk *)c,lVar9,what[3],false,false,group_info_14,'\f');
      lVar9 = (loc_conflict)loc(c_local._4_4_ + L'\x01',wStack_10 + L'\xffffffff');
      group_info_15.role = i1;
      group_info_15.index = i2;
      group_info_15.player_race._0_4_ = info.index;
      group_info_15.player_race._4_4_ = info.role;
      place_new_monster((chunk *)c,lVar9,what[3],false,false,group_info_15,'\f');
      lVar9 = (loc_conflict)loc(c_local._4_4_ + L'\xffffffff',wStack_10 + L'\x01');
      group_info_16.role = i1;
      group_info_16.index = i2;
      group_info_16.player_race._0_4_ = info.index;
      group_info_16.player_race._4_4_ = info.role;
      place_new_monster((chunk *)c,lVar9,what[3],false,false,group_info_16,'\f');
      lVar9 = (loc_conflict)loc(c_local._4_4_ + L'\x01',wStack_10 + L'\x01');
      group_info_17.role = i1;
      group_info_17.index = i2;
      group_info_17.player_race._0_4_ = info.index;
      group_info_17.player_race._4_4_ = info.role;
      place_new_monster((chunk *)c,lVar9,what[3],false,false,group_info_17,'\f');
      x1 = c_local._4_4_ + L'\xffffffff';
      while( true ) {
        if (c_local._4_4_ + L'\x01' < x1) break;
        lVar9 = (loc_conflict)loc(x1,wStack_10 + L'\x01');
        group_info_18.role = i1;
        group_info_18.index = i2;
        group_info_18.player_race._0_4_ = info.index;
        group_info_18.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,what[4],false,false,group_info_18,'\f');
        lVar9 = (loc_conflict)loc(x1,wStack_10 + L'\xffffffff');
        group_info_19.role = i1;
        group_info_19.index = i2;
        group_info_19.player_race._0_4_ = info.index;
        group_info_19.player_race._4_4_ = info.role;
        place_new_monster((chunk *)c,lVar9,what[4],false,false,group_info_19,'\f');
        x1 = x1 + L'\x01';
      }
      lVar9 = (loc_conflict)loc(c_local._4_4_ + L'\x01',wStack_10);
      group_info_20.role = i1;
      group_info_20.index = i2;
      group_info_20.player_race._0_4_ = info.index;
      group_info_20.player_race._4_4_ = info.role;
      place_new_monster((chunk *)c,lVar9,what[5],false,false,group_info_20,'\f');
      lVar9 = (loc_conflict)loc(c_local._4_4_ + L'\xffffffff',wStack_10);
      group_info_21.role = i1;
      group_info_21.index = i2;
      group_info_21.player_race._0_4_ = info.index;
      group_info_21.player_race._4_4_ = info.role;
      place_new_monster((chunk *)c,lVar9,what[5],false,false,group_info_21,'\f');
      for (y1 = wStack_10 + L'\xfffffffe'; y1 <= wStack_10 + L'\x02'; y1 = y1 + L'\x01') {
        for (x1 = c_local._4_4_ + L'\xfffffff7'; x1 <= c_local._4_4_ + L'\t'; x1 = x1 + L'\x01') {
          wVar5 = Rand_div(100);
          if (wVar5 < wVar1) {
            grid = loc(x1,y1);
            iVar6 = c->depth;
            uVar7 = Rand_div(3);
            place_object(c,grid,iVar6 + L'\n',(_Bool)((uVar7 != 0 ^ 0xffU) & 1),false,'\x04',L'\0');
          }
        }
      }
      centre_local.x._3_1_ = true;
    }
  }
  else {
    centre_local.x._3_1_ = false;
  }
  return centre_local.x._3_1_;
}

Assistant:

bool build_pit(struct chunk *c, struct loc centre, int rating)
{
	struct monster_race *what[16];
	int i, j, y, x, y1, x1, y2, x2;
	bool empty = false;
	int light = false;
	int alloc_obj;
	int height = 9;
	int width = 15;
	int group_index = 0;
	struct monster_group_info info = { 0, 0, 0 };

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* Large room */
	y1 = centre.y - height / 2;
	y2 = centre.y + height / 2;
	x1 = centre.x - width / 2;
	x2 = centre.x + width / 2;

	/* Generate new room, outer walls and inner floor */
	generate_room(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, light);
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_OUTER, false);
	fill_rectangle(c, y1, x1, y2, x2, FEAT_FLOOR, SQUARE_NONE);

	/* Advance to the center room */
	y1 = y1 + 2;
	y2 = y2 - 2;
	x1 = x1 + 2;
	x2 = x2 - 2;

	/* Generate inner walls; add one door as entrance */
	draw_rectangle(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_GRANITE,
		SQUARE_WALL_INNER, false);
	generate_hole(c, y1 - 1, x1 - 1, y2 + 1, x2 + 1, FEAT_CLOSED);

	/* Decide on the pit type */
	set_pit_type(c->depth, 1);
	event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, dun->pit_type->name);

	/* Chance of objects on the floor */
	alloc_obj = dun->pit_type->obj_rarity;
	
	/* Prepare allocation table */
	get_mon_num_prep(mon_pit_hook);

	/* Pick some monster types */
	for (i = 0; i < 16; i++) {
		/* Get a (hard) monster type */
		what[i] = get_mon_num(c->depth + 10, c->depth);

		/* Notice failure */
		if (!what[i]) empty = true;
	}

	/* Prepare allocation table */
	get_mon_num_prep(NULL);

	/* Oops */
	if (empty)
		return false;

	ROOM_LOG("Monster pit (%s)", dun->pit_type->name);

	/* Sort the entries XXX XXX XXX */
	for (i = 0; i < 16 - 1; i++) {
		/* Sort the entries */
		for (j = 0; j < 16 - 1; j++) {
			int i1 = j;
			int i2 = j + 1;

			int p1 = what[i1]->level;
			int p2 = what[i2]->level;

			/* Bubble */
			if (p1 > p2) {
				struct monster_race *tmp = what[i1];
				what[i1] = what[i2];
				what[i2] = tmp;
			}
		}
	}

	/* Select every other entry */
	for (i = 0; i < 8; i++)
		what[i] = what[i * 2];

	/* Increase the level rating */
	add_to_monster_rating(c, 3 + dun->pit_type->ave / 20);

	/* Get a group ID */
	group_index = monster_group_index_new(c);

	/* Center monster */
	info.index = group_index;
	info.role = MON_GROUP_LEADER;
	place_new_monster(c, centre, what[7], false, false, info, ORIGIN_DROP_PIT);

	/* Remaining monsters are servants */
	info.role = MON_GROUP_SERVANT;

	/* Top and bottom rows (middle) */
	for (x = centre.x - 3; x <= centre.x + 3; x++) {
		place_new_monster(c, loc(x, centre.y - 2), what[0], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y + 2), what[0], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	/* Corners */
	for (x = centre.x - 5; x <= centre.x - 4; x++) {
		place_new_monster(c, loc(x, centre.y - 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y + 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	for (x = centre.x + 4; x <= centre.x + 5; x++) {
		place_new_monster(c, loc(x, centre.y - 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y + 2), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	/* Corners */

	/* Middle columns */
	for (y = centre.y - 1; y <= centre.y + 1; y++) {
		place_new_monster(c, loc(centre.x - 5, y), what[0], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 5, y), what[0], false, false, info,
						  ORIGIN_DROP_PIT);

		place_new_monster(c, loc(centre.x - 4, y), what[1], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 4, y), what[1], false, false, info,
						  ORIGIN_DROP_PIT);

		place_new_monster(c, loc(centre.x - 3, y), what[2], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 3, y), what[2], false, false, info,
						  ORIGIN_DROP_PIT);

		place_new_monster(c, loc(centre.x - 2, y), what[3], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(centre.x + 2, y), what[3], false, false, info,
						  ORIGIN_DROP_PIT);
	}
    
	/* Corners around the middle monster */
	place_new_monster(c, loc(centre.x - 1, centre.y - 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x + 1, centre.y - 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x - 1, centre.y + 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x + 1, centre.y + 1), what[4], false, false,
					  info, ORIGIN_DROP_PIT);

	/* Above/Below the center monster */
	for (x = centre.x - 1; x <= centre.x + 1; x++) {
		place_new_monster(c, loc(x, centre.y + 1), what[5], false, false, info,
						  ORIGIN_DROP_PIT);
		place_new_monster(c, loc(x, centre.y - 1), what[5], false, false, info,
						  ORIGIN_DROP_PIT);
	}

	/* Next to the center monster */
	place_new_monster(c, loc(centre.x + 1, centre.y), what[6], false, false,
					  info, ORIGIN_DROP_PIT);
	place_new_monster(c, loc(centre.x - 1, centre.y), what[6], false, false,
					  info, ORIGIN_DROP_PIT);

	/* Place some objects */
	for (y = centre.y - 2; y <= centre.y + 2; y++) {
		for (x = centre.x - 9; x <= centre.x + 9; x++) {
			/* Occasionally place an item, making it good 1/3 of the time */
			if (randint0(100) < alloc_obj) 
				place_object(c, loc(x, y), c->depth + 10, one_in_(3), false,
							 ORIGIN_PIT, 0);
		}
	}

	return true;
}